

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
::cleanup(SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
          *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  __destroy_fn *unaff_retaddr;
  
  std::ranges::__destroy_fn::
  operator()<slang::SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>_&>
            (unaff_retaddr,this);
  bVar1 = isSmall(this);
  if (!bVar1) {
    operator_delete((void *)0x924bba);
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }